

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlIO.c
# Opt level: O0

void xmlRegisterHTTPPostCallbacks(void)

{
  if (xmlOutputCallbackInitialized == 0) {
    xmlRegisterDefaultOutputCallbacks();
  }
  xmlRegisterOutputCallbacks(xmlIOHTTPMatch,xmlIOHTTPDfltOpenW,xmlIOHTTPWrite,xmlIOHTTPClosePost);
  return;
}

Assistant:

void
xmlRegisterHTTPPostCallbacks( void ) {

    /*  Register defaults if not done previously  */

    if ( xmlOutputCallbackInitialized == 0 )
	xmlRegisterDefaultOutputCallbacks( );

    xmlRegisterOutputCallbacks(xmlIOHTTPMatch, xmlIOHTTPDfltOpenW,
	                       xmlIOHTTPWrite, xmlIOHTTPClosePost);
    return;
}